

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLogger.cpp
# Opt level: O3

ULONG __thiscall
Js::StackTraceHelper::GetStackTrace
          (StackTraceHelper *this,ULONG framesToSkip,ULONG framesToCapture,void **stackFrames)

{
  StackBackTrace SVar1;
  code *pcVar2;
  bool bVar3;
  ULONG UVar4;
  StackBackTrace *this_00;
  undefined4 *puVar5;
  ULONG UVar6;
  ulong uVar7;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType autoNestedHandledExceptionType;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_DisableCheck);
  this_00 = GetStackBackTrace(this,framesToCapture);
  UVar4 = StackBackTrace::Capture(this_00,framesToSkip);
  if (framesToCapture < UVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MemoryLogger.cpp"
                                ,0x44,"(capturedCount <= framesToCapture)",
                                "capturedCount <= framesToCapture");
    if (!bVar3) {
LAB_006f2b24:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  UVar6 = this_00->framesCount;
  if (UVar6 != 0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar7 = 0;
    do {
      SVar1 = this_00[uVar7 + 1];
      if (framesToCapture < uVar7) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MemoryLogger.cpp"
                                    ,0x47,"(i <= framesToCapture)","i <= framesToCapture");
        if (!bVar3) goto LAB_006f2b24;
        *puVar5 = 0;
        UVar6 = this_00->framesCount;
      }
      *(StackBackTrace *)(stackFrames + uVar7) = SVar1;
      uVar7 = uVar7 + 1;
    } while (uVar7 < UVar6);
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  return UVar4;
}

Assistant:

ULONG StackTraceHelper::GetStackTrace(ULONG framesToSkip, ULONG framesToCapture, void** stackFrames)
    {
#ifdef EXCEPTION_CHECK
        AutoNestedHandledExceptionType autoNestedHandledExceptionType(ExceptionType_DisableCheck);
#endif
        StackBackTrace* stackTrace = this->GetStackBackTrace(framesToCapture);
        ULONG capturedCount = stackTrace->Capture(framesToSkip);
        Assert(capturedCount <= framesToCapture);
        ULONG i = 0;
        stackTrace->Map([&i, framesToCapture, stackFrames](void* funcAddr){
            Assert(i <= framesToCapture);
            stackFrames[i++] = funcAddr;
        });
        return capturedCount;
    }